

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O3

int dbuf_put_self(DynBuf *s,size_t offset,size_t len)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = s->size;
  if (s->allocated_size < sVar2 + len) {
    iVar1 = dbuf_realloc(s,sVar2 + len);
    if (iVar1 != 0) {
      return -1;
    }
    sVar2 = s->size;
  }
  memcpy(s->buf + sVar2,s->buf + offset,len);
  s->size = s->size + len;
  return 0;
}

Assistant:

int dbuf_put_self(DynBuf *s, size_t offset, size_t len)
{
    if (unlikely((s->size + len) > s->allocated_size)) {
        if (dbuf_realloc(s, s->size + len))
            return -1;
    }
    memcpy(s->buf + s->size, s->buf + offset, len);
    s->size += len;
    return 0;
}